

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CWorker.hpp
# Opt level: O2

void __thiscall sftm::CWorker::WorkUntil(CWorker *this,CChainController *chainController)

{
  bool bVar1;
  CTask *pCVar2;
  
  do {
    if ((chainController->m_nCount).super___atomic_base<unsigned_int>._M_i == 0) {
      return;
    }
    do {
      pCVar2 = CConcurrentPtrQueue<sftm::CTask>::Pop(&this->m_taskQueue);
      if (pCVar2 != (CTask *)0x0) {
        (*pCVar2->_vptr_CTask[2])(pCVar2,this);
        LOCK();
        (pCVar2->m_chainController->m_nCount).super___atomic_base<unsigned_int>._M_i =
             (pCVar2->m_chainController->m_nCount).super___atomic_base<unsigned_int>._M_i - 1;
        UNLOCK();
        break;
      }
      bVar1 = FindWork(this);
    } while (bVar1);
  } while( true );
}

Assistant:

void WorkUntil(CChainController& chainController) noexcept
		{
			while (!chainController.IsFinished())
			{
				do
				{
					while (CTask* pTask = PopTask())
					{
						ExecuteTask(pTask);

						if (chainController.IsFinished())
							return;
					}
				} while (FindWork());
			}
		}